

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::FCDUIterCollationIterator::nextCodePoint
          (FCDUIterCollationIterator *this,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  UChar32 c_00;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  UChar32 trail;
  UChar32 c;
  UErrorCode *errorCode_local;
  FCDUIterCollationIterator *this_local;
  
  while( true ) {
    while (this->state != ITER_CHECK_FWD) {
      if ((this->state == ITER_IN_FCD_SEGMENT) && (this->pos != this->limit)) {
        uVar2 = uiter_next32_63((this->super_UIterCollationIterator).iter);
        iVar5 = 2;
        if (uVar2 < 0x10000) {
          iVar5 = 1;
        }
        this->pos = iVar5 + this->pos;
        return uVar2;
      }
      if ((2 < (int)this->state) &&
         (iVar5 = this->pos, iVar4 = UnicodeString::length(&this->normalized), iVar5 != iVar4)) {
        uVar2 = UnicodeString::char32At(&this->normalized,this->pos);
        iVar5 = 2;
        if (uVar2 < 0x10000) {
          iVar5 = 1;
        }
        this->pos = iVar5 + this->pos;
        return uVar2;
      }
      switchToForward(this);
    }
    uVar2 = (*(code *)((this->super_UIterCollationIterator).iter)->next)
                      ((this->super_UIterCollationIterator).iter);
    if ((int)uVar2 < 0) {
      return uVar2;
    }
    UVar1 = CollationFCD::hasTccc(uVar2);
    if (UVar1 == '\0') break;
    UVar1 = CollationFCD::maybeTibetanCompositeVowel(uVar2);
    if (UVar1 == '\0') {
      c_00 = (*(code *)((this->super_UIterCollationIterator).iter)->current)
                       ((this->super_UIterCollationIterator).iter);
      UVar1 = CollationFCD::hasLccc(c_00);
      if (UVar1 == '\0') break;
    }
    (*(code *)((this->super_UIterCollationIterator).iter)->previous)
              ((this->super_UIterCollationIterator).iter);
    UVar1 = nextSegment(this,errorCode);
    if (UVar1 == '\0') {
      return -1;
    }
  }
  if ((uVar2 & 0xfffffc00) != 0xd800) {
    return uVar2;
  }
  uVar3 = (*(code *)((this->super_UIterCollationIterator).iter)->next)
                    ((this->super_UIterCollationIterator).iter);
  if ((uVar3 & 0xfffffc00) != 0xdc00) {
    if ((int)uVar3 < 0) {
      return uVar2;
    }
    (*(code *)((this->super_UIterCollationIterator).iter)->previous)
              ((this->super_UIterCollationIterator).iter);
    return uVar2;
  }
  return uVar2 * 0x400 + uVar3 + -0x35fdc00;
}

Assistant:

UChar32
FCDUIterCollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == ITER_CHECK_FWD) {
            c = iter.next(&iter);
            if(c < 0) {
                return c;
            }
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        CollationFCD::hasLccc(iter.current(&iter))) {
                    iter.previous(&iter);
                    if(!nextSegment(errorCode)) {
                        return U_SENTINEL;
                    }
                    continue;
                }
            }
            if(U16_IS_LEAD(c)) {
                UChar32 trail = iter.next(&iter);
                if(U16_IS_TRAIL(trail)) {
                    return U16_GET_SUPPLEMENTARY(c, trail);
                } else if(trail >= 0) {
                    iter.previous(&iter);
                }
            }
            return c;
        } else if(state == ITER_IN_FCD_SEGMENT && pos != limit) {
            c = uiter_next32(&iter);
            pos += U16_LENGTH(c);
            U_ASSERT(c >= 0);
            return c;
        } else if(state >= IN_NORM_ITER_AT_LIMIT && pos != normalized.length()) {
            c = normalized.char32At(pos);
            pos += U16_LENGTH(c);
            return c;
        } else {
            switchToForward();
        }
    }
}